

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_util.c
# Opt level: O3

void bitset_set_list(uint64_t *words,uint16_t *list,uint64_t length)

{
  ushort *puVar1;
  ushort uVar2;
  ushort *puVar3;
  uint uVar4;
  long lVar5;
  ushort *puVar6;
  
  uVar4 = croaring_hardware_support();
  if ((uVar4 & 1) == 0) {
    if (length != 0) {
      lVar5 = 0;
      do {
        words[*(ushort *)((long)list + lVar5) >> 6] =
             words[*(ushort *)((long)list + lVar5) >> 6] |
             1L << ((byte)*(ushort *)((long)list + lVar5) & 0x3f);
        lVar5 = lVar5 + 2;
      } while (length * 2 != lVar5);
    }
  }
  else {
    puVar1 = list + length;
    if (3 < (long)length) {
      puVar3 = list + 3;
      do {
        puVar6 = puVar3;
        uVar2 = puVar6[-3] >> 6;
        words[uVar2] = words[uVar2] | 1L << ((ulong)puVar6[-3] & 0x3f);
        uVar2 = puVar6[-2] >> 6;
        words[uVar2] = words[uVar2] | 1L << ((ulong)puVar6[-2] & 0x3f);
        uVar2 = puVar6[-1] >> 6;
        words[uVar2] = words[uVar2] | 1L << ((ulong)puVar6[-1] & 0x3f);
        uVar2 = *puVar6 >> 6;
        words[uVar2] = words[uVar2] | 1L << ((ulong)*puVar6 & 0x3f);
        puVar3 = puVar6 + 4;
      } while (puVar6 + 4 < puVar1);
      list = puVar6 + 1;
    }
    for (; list != puVar1; list = list + 1) {
      uVar2 = *list >> 6;
      words[uVar2] = words[uVar2] | 1L << ((ulong)*list & 0x3f);
    }
  }
  return;
}

Assistant:

void bitset_set_list(uint64_t *words, const uint16_t *list, uint64_t length) {
    if (croaring_hardware_support() & ROARING_SUPPORTS_AVX2) {
        _asm_bitset_set_list(words, list, length);
    } else {
        _scalar_bitset_set_list(words, list, length);
    }
}